

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O1

void embree::avx2::
     BVHNIntersectorKHybrid<8,_4,_16777232,_false,_embree::avx2::ArrayIntersectorK_1<4,_embree::avx2::InstanceArrayIntersectorKMB<4>_>,_false>
     ::intersect(vint<4> *valid_i,Intersectors *This,RayHitK<4> *ray,RayQueryContext *context)

{
  undefined4 uVar1;
  size_t sVar2;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar3;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar4;
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar16;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar17;
  bool bVar18;
  ulong uVar19;
  long lVar20;
  NodeRef *pNVar21;
  size_t sVar22;
  ulong uVar23;
  ulong uVar24;
  uint uVar25;
  size_t sVar26;
  Primitive_conflict4 *prim;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar27;
  bool bVar28;
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar31;
  undefined1 in_ZMM0 [64];
  undefined1 auVar32 [64];
  vfloat_impl<4> __tmp;
  undefined1 auVar33 [16];
  vint4 ai;
  undefined1 auVar34 [16];
  vint4 ai_1;
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  vint4 ai_3;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  vint4 ai_2;
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  vint4 bi;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  vint4 bi_1;
  undefined1 auVar48 [16];
  vint4 bi_3;
  undefined1 auVar49 [16];
  vint4 bi_2;
  undefined1 auVar50 [16];
  undefined1 auVar51 [64];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [16];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  Precalculations pre;
  undefined1 local_3578 [16];
  vbool<4> valid_leaf;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    auVar29 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar29 = vpcmpeqd_avx(auVar29,(undefined1  [16])valid_i->field_0);
    if ((((auVar29 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar29 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar29 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar29[0xf] < '\0')
    {
      auVar41._8_4_ = 0x7fffffff;
      auVar41._0_8_ = 0x7fffffff7fffffff;
      auVar41._12_4_ = 0x7fffffff;
      auVar30 = vandps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar41);
      auVar33._8_4_ = 0x219392ef;
      auVar33._0_8_ = 0x219392ef219392ef;
      auVar33._12_4_ = 0x219392ef;
      auVar30 = vcmpps_avx(auVar30,auVar33,1);
      auVar30 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x60),auVar33,auVar30);
      auVar52 = vrcpps_avx(auVar30);
      auVar46._8_4_ = 0x3f800000;
      auVar46._0_8_ = &DAT_3f8000003f800000;
      auVar46._12_4_ = 0x3f800000;
      auVar54 = vfnmadd213ps_fma(auVar30,auVar52,auVar46);
      auVar30 = vandps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar41);
      auVar30 = vcmpps_avx(auVar30,auVar33,1);
      auVar50 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x50),auVar33,auVar30);
      auVar5 = vrcpps_avx(auVar50);
      auVar30 = vandps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar41);
      auVar30 = vcmpps_avx(auVar30,auVar33,1);
      auVar30 = vblendvps_avx(*(undefined1 (*) [16])(ray + 0x40),auVar33,auVar30);
      auVar33 = vfnmadd213ps_fma(auVar50,auVar5,auVar46);
      auVar50 = vrcpps_avx(auVar30);
      auVar30 = vfnmadd213ps_fma(auVar30,auVar50,auVar46);
      auVar41 = vfmadd132ps_fma(auVar30,auVar50,auVar50);
      auVar55 = ZEXT1664(auVar41);
      auVar5 = vfmadd132ps_fma(auVar33,auVar5,auVar5);
      auVar53 = ZEXT1664(auVar5);
      auVar52 = vfmadd132ps_fma(auVar54,auVar52,auVar52);
      auVar51 = ZEXT1664(auVar52);
      auVar30 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),ZEXT816(0) << 0x20);
      auVar50 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),ZEXT816(0) << 0x20);
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0._0_8_ = 0x7f8000007f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      aVar3.v = (__m128)vblendvps_avx(stack_near[0].field_0,auVar30,auVar29);
      auVar30._8_4_ = 0xff800000;
      auVar30._0_8_ = 0xff800000ff800000;
      auVar30._12_4_ = 0xff800000;
      local_3578 = vblendvps_avx(auVar30,auVar50,auVar29);
      pNVar21 = stack_node + 2;
      fVar6 = *(float *)ray;
      fVar7 = *(float *)(ray + 4);
      fVar8 = *(float *)(ray + 8);
      fVar9 = *(float *)(ray + 0xc);
      paVar27 = &stack_near[2].field_0;
      fVar10 = *(float *)(ray + 0x10);
      fVar11 = *(float *)(ray + 0x14);
      fVar12 = *(float *)(ray + 0x18);
      fVar13 = *(float *)(ray + 0x1c);
      auVar29._0_4_ = auVar52._0_4_ * -*(float *)(ray + 0x20);
      auVar29._4_4_ = auVar52._4_4_ * -*(float *)(ray + 0x24);
      auVar29._8_4_ = auVar52._8_4_ * -*(float *)(ray + 0x28);
      auVar29._12_4_ = auVar52._12_4_ * -*(float *)(ray + 0x2c);
      stack_node[0].ptr = 0xfffffffffffffff8;
      auVar56 = ZEXT1664((undefined1  [16])stack_near[0].field_0);
      stack_node[1].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      stack_near[1].field_0 = aVar3;
      do {
        paVar27 = paVar27 + -1;
        sVar26 = pNVar21[-1].ptr;
        pNVar21 = pNVar21 + -1;
        bVar18 = true;
        if (sVar26 != 0xfffffffffffffff8) {
          auVar32 = ZEXT1664((undefined1  [16])*paVar27);
          auVar30 = vcmpps_avx((undefined1  [16])*paVar27,local_3578,1);
          if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar30[0xf] < '\0') {
            do {
              auVar30 = auVar32._0_16_;
              uVar25 = (uint)sVar26;
              auVar54 = auVar55._0_16_;
              auVar52 = auVar53._0_16_;
              auVar50 = auVar51._0_16_;
              if ((sVar26 & 8) != 0) {
                if (sVar26 == 0xfffffffffffffff8) goto LAB_0063a2da;
                valid_leaf.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)vcmpps_avx(local_3578,auVar30,6)
                ;
                if (((((undefined1  [16])valid_leaf.field_0 >> 0x1f & (undefined1  [16])0x1) !=
                      (undefined1  [16])0x0 ||
                     ((undefined1  [16])valid_leaf.field_0 >> 0x3f & (undefined1  [16])0x1) !=
                     (undefined1  [16])0x0) ||
                    ((undefined1  [16])valid_leaf.field_0 >> 0x5f & (undefined1  [16])0x1) !=
                    (undefined1  [16])0x0) || valid_leaf.field_0._15_1_ < '\0') {
                  lVar20 = (ulong)(uVar25 & 0xf) - 8;
                  if (lVar20 != 0) {
                    prim = (Primitive_conflict4 *)(sVar26 & 0xfffffffffffffff0);
                    do {
                      InstanceArrayIntersectorKMB<4>::intersect(&valid_leaf,&pre,ray,context,prim);
                      prim = prim + 1;
                      lVar20 = lVar20 + -1;
                    } while (lVar20 != 0);
                  }
                  local_3578 = vblendvps_avx(local_3578,*(undefined1 (*) [16])(ray + 0x80),
                                             (undefined1  [16])valid_leaf.field_0);
                  auVar51 = ZEXT1664(auVar50);
                  auVar53 = ZEXT1664(auVar52);
                  auVar55 = ZEXT1664(auVar54);
                  auVar56 = ZEXT1664(CONCAT412(0x7f800000,CONCAT48(0x7f800000,0x7f8000007f800000)));
                }
                break;
              }
              uVar19 = sVar26 & 0xfffffffffffffff0;
              uVar23 = 0;
              auVar32 = ZEXT1664(auVar56._0_16_);
              uVar24 = 0;
              sVar26 = 8;
              do {
                sVar2 = *(size_t *)(uVar19 + uVar24 * 8);
                if (sVar2 != 8) {
                  uVar1 = *(undefined4 *)(uVar19 + 0x100 + uVar24 * 4);
                  auVar35._4_4_ = uVar1;
                  auVar35._0_4_ = uVar1;
                  auVar35._8_4_ = uVar1;
                  auVar35._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar19 + 0x40 + uVar24 * 4);
                  auVar34._4_4_ = uVar1;
                  auVar34._0_4_ = uVar1;
                  auVar34._8_4_ = uVar1;
                  auVar34._12_4_ = uVar1;
                  auVar33 = *(undefined1 (*) [16])(ray + 0x70);
                  auVar46 = vfmadd231ps_fma(auVar34,auVar33,auVar35);
                  uVar1 = *(undefined4 *)(uVar19 + 0x140 + uVar24 * 4);
                  auVar38._4_4_ = uVar1;
                  auVar38._0_4_ = uVar1;
                  auVar38._8_4_ = uVar1;
                  auVar38._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar19 + 0x80 + uVar24 * 4);
                  auVar36._4_4_ = uVar1;
                  auVar36._0_4_ = uVar1;
                  auVar36._8_4_ = uVar1;
                  auVar36._12_4_ = uVar1;
                  auVar34 = vfmadd231ps_fma(auVar36,auVar33,auVar38);
                  uVar1 = *(undefined4 *)(uVar19 + 0x180 + uVar24 * 4);
                  auVar42._4_4_ = uVar1;
                  auVar42._0_4_ = uVar1;
                  auVar42._8_4_ = uVar1;
                  auVar42._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar19 + 0xc0 + uVar24 * 4);
                  auVar39._4_4_ = uVar1;
                  auVar39._0_4_ = uVar1;
                  auVar39._8_4_ = uVar1;
                  auVar39._12_4_ = uVar1;
                  auVar38 = vfmadd231ps_fma(auVar39,auVar33,auVar42);
                  uVar1 = *(undefined4 *)(uVar19 + 0x120 + uVar24 * 4);
                  auVar43._4_4_ = uVar1;
                  auVar43._0_4_ = uVar1;
                  auVar43._8_4_ = uVar1;
                  auVar43._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar19 + 0x60 + uVar24 * 4);
                  auVar47._4_4_ = uVar1;
                  auVar47._0_4_ = uVar1;
                  auVar47._8_4_ = uVar1;
                  auVar47._12_4_ = uVar1;
                  auVar39 = vfmadd231ps_fma(auVar47,auVar33,auVar43);
                  uVar1 = *(undefined4 *)(uVar19 + 0x160 + uVar24 * 4);
                  auVar44._4_4_ = uVar1;
                  auVar44._0_4_ = uVar1;
                  auVar44._8_4_ = uVar1;
                  auVar44._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar19 + 0xa0 + uVar24 * 4);
                  auVar48._4_4_ = uVar1;
                  auVar48._0_4_ = uVar1;
                  auVar48._8_4_ = uVar1;
                  auVar48._12_4_ = uVar1;
                  auVar42 = vfmadd231ps_fma(auVar48,auVar33,auVar44);
                  uVar1 = *(undefined4 *)(uVar19 + 0x1a0 + uVar24 * 4);
                  auVar45._4_4_ = uVar1;
                  auVar45._0_4_ = uVar1;
                  auVar45._8_4_ = uVar1;
                  auVar45._12_4_ = uVar1;
                  uVar1 = *(undefined4 *)(uVar19 + 0xe0 + uVar24 * 4);
                  auVar49._4_4_ = uVar1;
                  auVar49._0_4_ = uVar1;
                  auVar49._8_4_ = uVar1;
                  auVar49._12_4_ = uVar1;
                  auVar43 = vfmadd231ps_fma(auVar49,auVar33,auVar45);
                  auVar15._4_4_ = auVar41._4_4_ * -fVar7;
                  auVar15._0_4_ = auVar41._0_4_ * -fVar6;
                  auVar15._8_4_ = auVar41._8_4_ * -fVar8;
                  auVar15._12_4_ = auVar41._12_4_ * -fVar9;
                  auVar35 = vfmadd213ps_fma(auVar46,auVar54,auVar15);
                  auVar14._4_4_ = auVar5._4_4_ * -fVar11;
                  auVar14._0_4_ = auVar5._0_4_ * -fVar10;
                  auVar14._8_4_ = auVar5._8_4_ * -fVar12;
                  auVar14._12_4_ = auVar5._12_4_ * -fVar13;
                  auVar36 = vfmadd213ps_fma(auVar34,auVar52,auVar14);
                  auVar38 = vfmadd213ps_fma(auVar38,auVar50,auVar29);
                  auVar39 = vfmadd213ps_fma(auVar39,auVar54,auVar15);
                  auVar42 = vfmadd213ps_fma(auVar42,auVar52,auVar14);
                  auVar43 = vfmadd213ps_fma(auVar43,auVar50,auVar29);
                  auVar46 = vpminsd_avx(auVar35,auVar39);
                  auVar34 = vpminsd_avx(auVar36,auVar42);
                  auVar46 = vpmaxsd_avx(auVar46,auVar34);
                  auVar34 = vpminsd_avx(auVar38,auVar43);
                  auVar46 = vpmaxsd_avx(auVar46,auVar34);
                  auVar34 = vpmaxsd_avx(auVar35,auVar39);
                  auVar35 = vpmaxsd_avx(auVar36,auVar42);
                  auVar35 = vpminsd_avx(auVar34,auVar35);
                  auVar34 = vpmaxsd_avx(auVar38,auVar43);
                  auVar34 = vpminsd_avx(auVar34,local_3578);
                  auVar35 = vpminsd_avx(auVar35,auVar34);
                  auVar34 = vpmaxsd_avx(auVar46,(undefined1  [16])aVar3);
                  if ((uVar25 & 7) == 6) {
                    auVar34 = vcmpps_avx(auVar34,auVar35,2);
                    uVar1 = *(undefined4 *)(uVar19 + 0x1c0 + uVar24 * 4);
                    auVar37._4_4_ = uVar1;
                    auVar37._0_4_ = uVar1;
                    auVar37._8_4_ = uVar1;
                    auVar37._12_4_ = uVar1;
                    auVar35 = vcmpps_avx(auVar37,auVar33,2);
                    uVar1 = *(undefined4 *)(uVar19 + 0x1e0 + uVar24 * 4);
                    auVar40._4_4_ = uVar1;
                    auVar40._0_4_ = uVar1;
                    auVar40._8_4_ = uVar1;
                    auVar40._12_4_ = uVar1;
                    auVar33 = vcmpps_avx(auVar33,auVar40,1);
                    auVar33 = vandps_avx(auVar35,auVar33);
                    auVar33 = vandps_avx(auVar33,auVar34);
                  }
                  else {
                    auVar33 = vcmpps_avx(auVar34,auVar35,2);
                  }
                  auVar34 = vcmpps_avx(local_3578,auVar30,6);
                  auVar33 = vandps_avx(auVar33,auVar34);
                  auVar33 = vpslld_avx(auVar33,0x1f);
                  if ((((auVar33 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar33 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar33 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar33[0xf] < '\0') {
                    aVar4 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                            vblendvps_avx(auVar56._0_16_,auVar46,auVar33);
                    aVar31 = auVar32._0_16_;
                    auVar33 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])aVar31,1);
                    sVar22 = sVar2;
                    aVar16 = aVar31;
                    aVar17 = aVar4;
                    if (((((auVar33 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                          (auVar33 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         (auVar33 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                         -1 < auVar33[0xf]) ||
                       (bVar28 = sVar26 != 8, sVar22 = sVar26, sVar26 = sVar2, aVar16 = aVar4,
                       aVar17 = aVar31, bVar28)) {
                      uVar23 = uVar23 + 1;
                      pNVar21->ptr = sVar22;
                      pNVar21 = pNVar21 + 1;
                      *(anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *)paVar27->v = aVar17;
                      paVar27 = paVar27 + 1;
                      auVar32 = ZEXT1664((undefined1  [16])aVar16);
                    }
                    else {
                      auVar32 = ZEXT1664((undefined1  [16])aVar4);
                    }
                  }
                }
              } while ((sVar2 != 8) && (bVar28 = uVar24 < 7, uVar24 = uVar24 + 1, bVar28));
              if (1 < uVar23 && sVar26 != 8) {
                aVar4 = paVar27[-2];
                auVar30 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])paVar27[-1],1);
                if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    auVar30[0xf] < '\0') {
                  paVar27[-2] = paVar27[-1];
                  paVar27[-1] = aVar4;
                  auVar30 = vpermilps_avx(*(undefined1 (*) [16])(pNVar21 + -2),0x4e);
                  *(undefined1 (*) [16])(pNVar21 + -2) = auVar30;
                }
                if (uVar23 != 2) {
                  aVar4 = paVar27[-3];
                  auVar30 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])paVar27[-1],1);
                  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar30[0xf] < '\0') {
                    paVar27[-3] = paVar27[-1];
                    paVar27[-1] = aVar4;
                    sVar2 = pNVar21[-3].ptr;
                    pNVar21[-3].ptr = pNVar21[-1].ptr;
                    pNVar21[-1].ptr = sVar2;
                  }
                  aVar4 = paVar27[-3];
                  auVar30 = vcmpps_avx((undefined1  [16])aVar4,(undefined1  [16])paVar27[-2],1);
                  if ((((auVar30 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                       (auVar30 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar30 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      auVar30[0xf] < '\0') {
                    paVar27[-3] = paVar27[-2];
                    paVar27[-2] = aVar4;
                    auVar30 = vpermilps_avx(*(undefined1 (*) [16])(pNVar21 + -3),0x4e);
                    *(undefined1 (*) [16])(pNVar21 + -3) = auVar30;
                  }
                }
              }
            } while (sVar26 != 8);
          }
          bVar18 = false;
        }
LAB_0063a2da:
      } while (!bVar18);
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::intersect(vint<K>* __restrict__ valid_i,
                                                                                               Accel::Intersectors* __restrict__ This,
                                                                                               RayHitK<K>& __restrict__ ray,
                                                                                               RayQueryContext* __restrict__ context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
            
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        intersectCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out invalid rays */
      vbool<K> valid = *valid_i == -1;
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      size_t valid_bits = movemask(valid);

#if defined(__AVX__)
      STAT3(normal.trav_hit_boxes[popcnt(movemask(valid))], 1, 1, 1);
#endif

      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      if (single)
      {
        tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));
        
        for (; valid_bits!=0; ) {
          const size_t i = bscf(valid_bits);
          intersect1(This, bvh, bvh->root, i, pre, ray, tray, context);
        }
        return;
      }

       /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      vint<K> octant = ray.octant();
      octant = select(valid, octant, vint<K>(0xffffffff));

      /* test whether we have ray with opposing direction signs in the packet */
      bool split = false;
      {
        size_t bits = valid_bits;
        vbool<K> vsplit( false );
        do
        {
          const size_t valid_index = bsf(bits);
          vbool<K> octant_valid = octant[valid_index] == octant;
          bits &= ~(size_t)movemask(octant_valid);
          vsplit |= vint<K>(octant[valid_index]) == (octant^vint<K>(0x7));
        } while (bits);
        if (any(vsplit)) split = true;
      }

      do
      {
        const size_t valid_index = bsf(valid_bits);
        const vint<K> diff_octant = vint<K>(octant[valid_index])^octant;
        const vint<K> count_diff_octant = \
          ((diff_octant >> 2) & 1) +
          ((diff_octant >> 1) & 1) +
          ((diff_octant >> 0) & 1);

        vbool<K> octant_valid = (count_diff_octant <= 1) & (octant != vint<K>(0xffffffff));
        if (!single || !split) octant_valid = valid; // deactivate octant sorting in pure chunk mode, otherwise instance traversal performance goes down 


        octant = select(octant_valid,vint<K>(0xffffffff),octant);
        valid_bits &= ~(size_t)movemask(octant_valid);

        tray.tnear = select(octant_valid, org_ray_tnear, vfloat<K>(pos_inf));
        tray.tfar  = select(octant_valid, org_ray_tfar , vfloat<K>(neg_inf));

        /* allocate stack and push root node */
        vfloat<K> stack_near[stackSizeChunk];
        NodeRef stack_node[stackSizeChunk];
        stack_node[0] = BVH::invalidNode;
        stack_near[0] = inf;
        stack_node[1] = bvh->root;
        stack_near[1] = tray.tnear;
        NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
        NodeRef* __restrict__ sptr_node = stack_node + 2;
        vfloat<K>* __restrict__ sptr_near = stack_near + 2;

        while (1) pop:
        {
          /* pop next node from stack */
          assert(sptr_node > stack_node);
          sptr_node--;
          sptr_near--;
          NodeRef cur = *sptr_node;
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* cull node if behind closest hit point */
          vfloat<K> curDist = *sptr_near;
          const vbool<K> active = curDist < tray.tfar;
          if (unlikely(none(active)))
            continue;

          /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
          if (single)
#endif
          {
            size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
            if (unlikely(popcnt(bits) <= switchThreshold))
#endif
            {
              for (; bits!=0; ) {
                const size_t i = bscf(bits);
                intersect1(This, bvh, cur, i, pre, ray, tray, context);
              }
              tray.tfar = min(tray.tfar, ray.tfar);
              continue;
            }
          }
#endif
          while (likely(!cur.isLeaf()))
          {
            /* process nodes */
            const vbool<K> valid_node = tray.tfar > curDist;
            STAT3(normal.trav_nodes, 1, popcnt(valid_node), K);
            const NodeRef nodeRef = cur;
            const BaseNode* __restrict__ const node = nodeRef.baseNode();

            /* set cur to invalid */
            cur = BVH::emptyNode;
            curDist = pos_inf;

            size_t num_child_hits = 0;

            for (unsigned i = 0; i < N; i++)
            {
              const NodeRef child = node->children[i];
              if (unlikely(child == BVH::emptyNode)) break;
              vfloat<K> lnearP;
              vbool<K> lhit = valid_node;
              BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

              /* if we hit the child we choose to continue with that child if it
                 is closer than the current next child, or we push it onto the stack */
              if (likely(any(lhit)))
              {                                
                assert(sptr_node < stackEnd);
                assert(child != BVH::emptyNode);
                const vfloat<K> childDist = select(lhit, lnearP, inf);
                /* push cur node onto stack and continue with hit child */
                if (any(childDist < curDist))
                {
                  if (likely(cur != BVH::emptyNode)) {
                    num_child_hits++;
                    *sptr_node = cur; sptr_node++;
                    *sptr_near = curDist; sptr_near++;
                  }
                  curDist = childDist;
                  cur = child;
                }

                /* push hit child onto stack */
                else {
                  num_child_hits++;                  
                  *sptr_node = child; sptr_node++;
                  *sptr_near = childDist; sptr_near++;
                }
              }
            }

#if defined(__AVX__)
            //STAT3(normal.trav_hit_boxes[num_child_hits], 1, 1, 1);
#endif

            if (unlikely(cur == BVH::emptyNode))
              goto pop;
            
            /* improved distance sorting for 3 or more hits */
            if (unlikely(num_child_hits >= 2))
            {
              if (any(sptr_near[-2] < sptr_near[-1]))
              {
                std::swap(sptr_near[-2],sptr_near[-1]);
                std::swap(sptr_node[-2],sptr_node[-1]);
              }
              if (unlikely(num_child_hits >= 3))
              {
                if (any(sptr_near[-3] < sptr_near[-1]))
                {
                  std::swap(sptr_near[-3],sptr_near[-1]);
                  std::swap(sptr_node[-3],sptr_node[-1]);
                }
                if (any(sptr_near[-3] < sptr_near[-2]))
                {
                  std::swap(sptr_near[-3],sptr_near[-2]);
                  std::swap(sptr_node[-3],sptr_node[-2]);
                }
              }
            }

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
            if (single)
            {
              // seems to be the best place for testing utilization
              if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
              {
                *sptr_node++ = cur;
                *sptr_near++ = curDist;
                goto pop;
              }
            }
#endif
          }

          /* return if stack is empty */
          if (unlikely(cur == BVH::invalidNode)) {
            assert(sptr_node == stack_node);
            break;
          }

          /* intersect leaf */
          assert(cur != BVH::emptyNode);
          const vbool<K> valid_leaf = tray.tfar > curDist;
          STAT3(normal.trav_leaves, 1, popcnt(valid_leaf), K);
          if (unlikely(none(valid_leaf))) continue;
          size_t items; const Primitive* prim = (Primitive*)cur.leaf(items);

          size_t lazy_node = 0;
          PrimitiveIntersectorK::intersect(valid_leaf, This, pre, ray, context, prim, items, tray, lazy_node);
          tray.tfar = select(valid_leaf, ray.tfar, tray.tfar);

          if (unlikely(lazy_node)) {
            *sptr_node = lazy_node; sptr_node++;
            *sptr_near = neg_inf;   sptr_near++;
          }
        }
      } while(valid_bits);
    }